

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O1

void chunk_list_add(chunk_conflict *c)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (uint)chunk_list_max * -0x33333333;
  if ((uVar1 >> 1 | (uint)((uVar1 & 1) != 0) << 0x1f) < 0x1999999a) {
    chunk_list = (chunk_conflict **)mem_realloc(chunk_list,(ulong)(uint)chunk_list_max * 8 + 0x50);
  }
  uVar2 = (ulong)chunk_list_max;
  chunk_list_max = chunk_list_max + 1;
  chunk_list[uVar2] = c;
  return;
}

Assistant:

void chunk_list_add(struct chunk *c)
{
	int newsize = (chunk_list_max + CHUNK_LIST_INCR) *	sizeof(struct chunk *);

	/* Lengthen the list if necessary */
	if ((chunk_list_max % CHUNK_LIST_INCR) == 0)
		chunk_list = (struct chunk **) mem_realloc(chunk_list, newsize);

	/* Add the new one */
	chunk_list[chunk_list_max++] = c;
}